

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_object_property_msg(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *pcVar3;
  
  pvVar2 = parser_priv(p);
  pcVar3 = parser_getstr(p,"msg");
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    string_free(*(char **)((long)pvVar2 + 200));
    pcVar3 = string_make(pcVar3);
    *(char **)((long)pvVar2 + 200) = pcVar3;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_object_property_msg(struct parser *p) {
	struct obj_property *prop = parser_priv(p);
	const char *msg = parser_getstr(p, "msg");

	if (!prop) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	string_free(prop->msg);
	prop->msg = string_make(msg);
	return PARSE_ERROR_NONE;
}